

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O2

void customrequest_helper(OperationConfig *config,HttpReq req,char *method)

{
  undefined8 uVar1;
  int iVar2;
  
  if (method != (char *)0x0) {
    uVar1 = *(undefined8 *)(&DAT_0012e020 + (ulong)req * 8);
    iVar2 = curl_strequal(method,uVar1);
    if (iVar2 != 0) {
      notef(config->global,"Unnecessary use of -X or --request, %s is already inferred.\n",uVar1);
      return;
    }
    iVar2 = curl_strequal(method,"head");
    if (iVar2 != 0) {
      warnf(config->global,
            "Setting custom HTTP method to HEAD with -X/--request may not work the way you want. Consider using -I/--head instead.\n"
           );
      return;
    }
  }
  return;
}

Assistant:

void customrequest_helper(struct OperationConfig *config, HttpReq req,
                          char *method)
{
  /* this mirrors the HttpReq enum in tool_sdecls.h */
  const char *dflt[]= {
    "GET",
    "GET",
    "HEAD",
    "POST",
    "POST"
  };

  if(!method)
    ;
  else if(curl_strequal(method, dflt[req])) {
    notef(config->global, "Unnecessary use of -X or --request, %s is already "
          "inferred.\n", dflt[req]);
  }
  else if(curl_strequal(method, "head")) {
    warnf(config->global,
          "Setting custom HTTP method to HEAD with -X/--request may not work "
          "the way you want. Consider using -I/--head instead.\n");
  }
}